

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O0

string * __thiscall
Catch::StringMaker<char_const*,void>::convert_abi_cxx11_
          (string *__return_storage_ptr__,StringMaker<char_const*,void> *this,char *str)

{
  size_type in_RCX;
  StringRef string;
  allocator<char> local_29;
  StringRef local_28;
  StringMaker<char_const*,void> *local_18;
  char *str_local;
  
  local_18 = this;
  str_local = (char *)__return_storage_ptr__;
  if (this == (StringMaker<char_const*,void> *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"{null string}",&local_29);
    std::allocator<char>::~allocator(&local_29);
  }
  else {
    StringRef::StringRef(&local_28,(char *)this);
    string.m_size = in_RCX;
    string.m_start = (char *)local_28.m_size;
    Detail::convertIntoString_abi_cxx11_(__return_storage_ptr__,(Detail *)local_28.m_start,string);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringMaker<char const*>::convert(char const* str) {
    if (str) {
        return Detail::convertIntoString( str );
    } else {
        return{ "{null string}" };
    }
}